

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-utils.c
# Opt level: O2

int coda_path_from_path(char *initialpath,int is_filepath,char *appendpath,char **resultpath)

{
  char cVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  ulong uVar5;
  size_t sVar6;
  char *__dest;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  char *pcVar11;
  
  uVar5 = strlen(initialpath);
  if (appendpath == (char *)0x0) {
    uVar8 = 0;
  }
  else {
    sVar6 = strlen(appendpath);
    uVar8 = (uint)sVar6;
  }
  if (0 < (int)(uint)uVar5 && is_filepath != 0) {
    uVar5 = (ulong)((uint)uVar5 & 0x7fffffff);
    do {
      if ((initialpath[uVar5 - 1] == '/') || (initialpath[uVar5 - 1] == '\\')) goto LAB_0012a070;
      bVar2 = 1 < (long)uVar5;
      uVar5 = uVar5 - 1;
    } while (bVar2);
    uVar5 = 0;
  }
LAB_0012a070:
  __dest = (char *)malloc((long)(int)(uVar8 + (int)uVar5 + 2));
  *resultpath = __dest;
  if (__dest == (char *)0x0) {
    coda_set_error(-1,"out of memory (could not duplicate string) (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-utils.c"
                   ,0x1e1);
    return -1;
  }
  if ((int)uVar5 < 1) {
    pcVar11 = __dest;
    if ((int)uVar8 < 1) goto LAB_0012a0f5;
  }
  else {
    memcpy(__dest,initialpath,uVar5 & 0xffffffff);
    pcVar11 = __dest + (uVar5 & 0xffffffff);
    if ((int)uVar8 < 1) goto LAB_0012a0f5;
    *pcVar11 = '/';
    pcVar11 = pcVar11 + 1;
  }
  memcpy(pcVar11,appendpath,(ulong)uVar8);
  pcVar11 = pcVar11 + uVar8;
LAB_0012a0f5:
  *pcVar11 = '\0';
  cVar3 = *__dest;
  if (cVar3 != '\0') {
    for (uVar5 = 0; (cVar3 == '.' && (__dest[uVar5 + 1] == '/')); uVar5 = uVar5 + 2) {
      cVar3 = __dest[uVar5 + 2];
    }
    uVar7 = 0;
LAB_0012a120:
    lVar9 = (long)(int)uVar5;
    cVar3 = __dest[lVar9];
    iVar4 = (int)uVar7;
    if ((cVar3 == '/') || (cVar3 == '\\')) goto LAB_0012a132;
    if (cVar3 != '\0') {
      uVar8 = (int)uVar5 + 1;
      goto LAB_0012a1b0;
    }
    if (iVar4 == 0) {
      *__dest = '.';
      iVar4 = 1;
    }
    __dest[iVar4] = '\0';
  }
  return 0;
LAB_0012a132:
  uVar10 = lVar9 + 1;
  uVar8 = (uint)uVar10;
  cVar1 = __dest[lVar9 + 1];
  uVar5 = uVar10 & 0xffffffff;
  if ((cVar1 == '\\') || (uVar5 = uVar10 & 0xffffffff, cVar1 == '/')) goto LAB_0012a120;
  if (cVar1 == '.') {
    uVar5 = lVar9 + 2;
    cVar1 = __dest[lVar9 + 2];
    if (((cVar1 == '\0') || (cVar1 == '/')) || (cVar1 == '\\')) goto LAB_0012a120;
    if ((cVar1 == '.') &&
       (((cVar1 = __dest[lVar9 + 3], cVar1 == '\0' || (cVar1 == '/')) || (cVar1 == '\\')))) {
      if (((iVar4 < 2) || (__dest[uVar7 - 1] != '.')) || (__dest[uVar7 - 2] != '.')) {
LAB_0012a1ce:
        uVar5 = lVar9 + 3U & 0xffffffff;
        uVar10 = uVar7;
        do {
          uVar10 = uVar10 - 1;
          if ((int)uVar7 < 1) goto LAB_0012a1b0;
          uVar7 = (ulong)((int)uVar7 - 1);
        } while ((__dest[uVar10 & 0xffffffff] != '/') && (__dest[uVar10 & 0xffffffff] != '\\'));
        goto LAB_0012a120;
      }
      if (iVar4 == 2) {
        iVar4 = 2;
      }
      else if ((__dest[uVar7 - 3] != '/') && (__dest[uVar7 - 3] != '\\')) goto LAB_0012a1ce;
    }
  }
LAB_0012a1b0:
  __dest[iVar4] = cVar3;
  uVar7 = (ulong)(iVar4 + 1);
  uVar5 = (ulong)uVar8;
  goto LAB_0012a120;
}

Assistant:

int coda_path_from_path(const char *initialpath, int is_filepath, const char *appendpath, char **resultpath)
{
    char *path;
    int initialpath_length;
    int appendpath_length;

    initialpath_length = (int)strlen(initialpath);
    appendpath_length = (appendpath == NULL ? 0 : (int)strlen(appendpath));

    if (is_filepath && initialpath_length > 0)
    {
        /* remove trailing parth */
        while (initialpath_length > 0 && initialpath[initialpath_length - 1] != '/' &&
               initialpath[initialpath_length - 1] != '\\')
        {
            initialpath_length--;
        }
    }

    *resultpath = malloc(initialpath_length + 1 + appendpath_length + 1);
    if (*resultpath == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not duplicate string) (%s:%u)", __FILE__,
                       __LINE__);
        return -1;
    }
    path = *resultpath;
    if (initialpath_length > 0)
    {
        memcpy(path, initialpath, initialpath_length);
        path += initialpath_length;
        if (appendpath_length > 0)
        {
            *path = '/';
            path++;
        }
    }
    if (appendpath_length > 0)
    {
        memcpy(path, appendpath, appendpath_length);
        path += appendpath_length;
    }
    *path = '\0';

    clean_path(*resultpath);

    return 0;
}